

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall
obs::safe_list<obs::slot<void_()>_>::delete_nodes(safe_list<obs::slot<void_()>_> *this,bool all)

{
  node *pnVar1;
  node *local_40;
  node *node;
  node *next;
  node *prev;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  bool all_local;
  safe_list<obs::slot<void_()>_> *this_local;
  
  lock._M_device._7_1_ = all;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_mutex_nodes);
  if (((lock._M_device._7_1_ & 1) != 0) || ((this->m_delete_nodes & 1U) != 0)) {
    next = (node *)0x0;
    pnVar1 = this->m_first;
    while (local_40 = pnVar1, local_40 != (node *)0x0) {
      pnVar1 = local_40->next;
      if (((lock._M_device._7_1_ & 1) == 0) &&
         ((local_40->value != (slot<void_()> *)0x0 || (local_40->locks != 0)))) {
        next = local_40;
      }
      else {
        if (next == (node *)0x0) {
          this->m_first = pnVar1;
          if (local_40 == this->m_last) {
            this->m_last = this->m_first;
          }
        }
        else {
          next->next = pnVar1;
          if (local_40 == this->m_last) {
            this->m_last = next;
          }
        }
        if (local_40->locks != 0) {
          __assert_fail("!node->locks",
                        "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/./obs/safe_list.h"
                        ,0x186,
                        "void obs::safe_list<obs::slot<void ()>>::delete_nodes(bool) [T = obs::slot<void ()>]"
                       );
        }
        if (local_40 != (node *)0x0) {
          operator_delete(local_40);
        }
      }
    }
    this->m_delete_nodes = false;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void delete_nodes(bool all) {
    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!all && !m_delete_nodes)
      return;

    node* prev = nullptr;
    node* next = nullptr;

    for (node* node=m_first; node; node=next) {
      next = node->next;

      if (all || (!node->value && !node->locks)) {
        if (prev) {
          prev->next = next;
          if (node == m_last)
            m_last = prev;
        }
        else {
          m_first = next;
          if (node == m_last)
            m_last = m_first;
        }

        assert(!node->locks);
        delete node;
      }
      else {
        prev = node;
      }
    }

    m_delete_nodes = false;
  }